

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Prune(ShardedLRUCache *this)

{
  bool bVar1;
  LRUHandle *pLVar2;
  Mutex *__mutex;
  long lVar3;
  long in_FS_OFFSET;
  Slice local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = 0;
  do {
    if (lVar3 == 0x10) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
    __mutex = &this->shard_[lVar3].mutex_;
    std::mutex::lock(&__mutex->mu_);
    while (pLVar2 = this->shard_[lVar3].lru_.next, pLVar2 != &this->shard_[lVar3].lru_) {
      if (pLVar2->refs != 1) {
        __assert_fail("e->refs == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/cache.cc"
                      ,0x147,"void leveldb::(anonymous namespace)::LRUCache::Prune()");
      }
      local_48 = LRUHandle::key(pLVar2);
      pLVar2 = HandleTable::Remove(&this->shard_[lVar3].table_,&local_48,pLVar2->hash);
      bVar1 = LRUCache::FinishErase(this->shard_ + lVar3,pLVar2);
      if (!bVar1) {
        __assert_fail("erased",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/cache.cc"
                      ,0x14a,"void leveldb::(anonymous namespace)::LRUCache::Prune()");
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void Prune() override {
    for (int s = 0; s < kNumShards; s++) {
      shard_[s].Prune();
    }
  }